

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O3

void sg_init_pipeline(sg_pipeline pip_id,sg_pipeline_desc *desc)

{
  _sg_pipeline_t *pip;
  sg_pipeline_desc desc_def;
  sg_pipeline_desc sStack_248;
  
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e26,"void sg_init_pipeline(sg_pipeline, const sg_pipeline_desc *)");
  }
  _sg_pipeline_desc_defaults(&sStack_248,desc);
  if (pip_id.id != 0) {
    pip = _sg_pipeline_at(&_sg.pools,pip_id.id);
    if ((pip->slot).id == pip_id.id) {
      if ((pip->slot).state != SG_RESOURCESTATE_ALLOC) {
        if (_sg.desc.logger.log_cb != (_func_void_char_ptr_void_ptr *)0x0) {
          (*_sg.desc.logger.log_cb)
                    ("sg_init_pipeline: pipeline must be in alloc state\n",_sg.desc.logger.user_data
                    );
          return;
        }
        puts("sg_init_pipeline: pipeline must be in alloc state\n");
        return;
      }
      _sg_init_pipeline(pip,&sStack_248);
      if (((pip->slot).state & ~SG_RESOURCESTATE_ALLOC) != SG_RESOURCESTATE_VALID) {
        __assert_fail("(pip->slot.state == SG_RESOURCESTATE_VALID) || (pip->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e2c,"void sg_init_pipeline(sg_pipeline, const sg_pipeline_desc *)");
      }
    }
  }
  return;
}

Assistant:

inline void sg_init_pipeline(sg_pipeline pip_id, const sg_pipeline_desc& desc) { return sg_init_pipeline(pip_id, &desc); }